

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O3

GLuint make_shader(GLenum type,char *text)

{
  GLuint GVar1;
  GLsizei log_length;
  GLint shader_ok;
  char info_log [8192];
  char *local_2038;
  int local_202c [2051];
  
  local_2038 = text;
  GVar1 = (*glad_glCreateShader)(type);
  if (GVar1 == 0) {
    GVar1 = 0;
  }
  else {
    (*glad_glShaderSource)(GVar1,1,&local_2038,(GLint *)0x0);
    (*glad_glCompileShader)(GVar1);
    (*glad_glGetShaderiv)(GVar1,0x8b81,local_202c);
    if (local_202c[0] != 1) {
      make_shader_cold_1();
      GVar1 = 0;
    }
  }
  return GVar1;
}

Assistant:

static GLuint make_shader(GLenum type, const char* text)
{
    GLuint shader;
    GLint shader_ok;
    GLsizei log_length;
    char info_log[8192];

    shader = glCreateShader(type);
    if (shader != 0)
    {
        glShaderSource(shader, 1, (const GLchar**)&text, NULL);
        glCompileShader(shader);
        glGetShaderiv(shader, GL_COMPILE_STATUS, &shader_ok);
        if (shader_ok != GL_TRUE)
        {
            fprintf(stderr, "ERROR: Failed to compile %s shader\n", (type == GL_FRAGMENT_SHADER) ? "fragment" : "vertex" );
            glGetShaderInfoLog(shader, 8192, &log_length,info_log);
            fprintf(stderr, "ERROR: \n%s\n\n", info_log);
            glDeleteShader(shader);
            shader = 0;
        }
    }
    return shader;
}